

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O1

void __thiscall MeterPrivate::drawScale(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  ulong uVar8;
  double dVar9;
  QVector<qreal> alreadyDrawn;
  double local_b0;
  double local_a8;
  double local_a0;
  QPodArrayOps<double> local_98;
  double local_80;
  ulong local_70;
  MeterPrivate *local_68;
  undefined8 uStack_60;
  QColor *local_50;
  double local_48;
  undefined8 uStack_40;
  
  QPainter::save();
  QPainter::setPen((QColor *)painter);
  local_80 = params->margin;
  local_98.super_QArrayDataPointer<double>.d = (Data *)((params->rect).xp + local_80);
  local_98.super_QArrayDataPointer<double>.ptr = (double *)((params->rect).yp + local_80);
  local_98.super_QArrayDataPointer<double>.size =
       (qsizetype)(((params->rect).w - local_80) - local_80);
  local_80 = ((params->rect).h - local_80) - local_80;
  QPainter::drawArc((QRectF *)painter,(int)&local_98,(int)((-90.0 - params->startScaleAngle) * 16.0)
                   );
  local_98.super_QArrayDataPointer<double>.d = (Data *)(double)this->radius;
  local_98.super_QArrayDataPointer<double>.ptr =
       (double *)local_98.super_QArrayDataPointer<double>.d;
  QPainter::translate((QPointF *)painter);
  QPainter::rotate(params->startScaleAngle);
  local_98.super_QArrayDataPointer<double>.d = (Data *)0x0;
  local_98.super_QArrayDataPointer<double>.ptr = (double *)0x0;
  local_98.super_QArrayDataPointer<double>.size = 0;
  local_b0 = params->startScaleAngle;
  QtPrivate::QPodArrayOps<double>::emplace<double&>(&local_98,0,&local_b0);
  dVar9 = this->scaleGridStep;
  if (dVar9 <= 0.0) {
    local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
    local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->gridLabelSize) -
                                          params->margin) << 0x20);
    QPainter::drawLines((QLine *)painter,(int)&local_b0);
    QPainter::rotate(params->scaleDegree);
    local_b0 = params->scaleDegree;
    QtPrivate::QPodArrayOps<double>::emplace<double&>
              (&local_98,local_98.super_QArrayDataPointer<double>.size,&local_b0);
    local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
    local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->gridLabelSize) -
                                          params->margin) << 0x20);
    QPainter::drawLines((QLine *)painter,(int)&local_b0);
  }
  else {
    dVar2 = this->maxValue - this->minValue;
    local_48 = dVar2 / dVar9;
    uStack_40 = 0;
    uVar3 = (uint)local_48;
    local_70 = (ulong)uVar3;
    local_a0 = dVar9;
    local_68 = this;
    local_50 = &this->textColor;
    if (-1 < (int)uVar3) {
      local_a0 = dVar9 * (params->scaleDegree / dVar2);
      iVar5 = 0;
      do {
        local_b0 = (double)((ulong)(uint)(int)((double)local_68->radius - params->margin) << 0x20);
        local_a8 = (double)((ulong)(uint)(int)(((double)local_68->radius - params->gridLabelSize) -
                                              params->margin) << 0x20);
        QPainter::drawLines((QLine *)painter,(int)&local_b0);
        QPainter::rotate(local_a0);
        local_b0 = (double)iVar5 * local_a0 + params->startScaleAngle;
        QtPrivate::QPodArrayOps<double>::emplace<double&>
                  (&local_98,local_98.super_QArrayDataPointer<double>.size,&local_b0);
        iVar5 = iVar5 + 1;
      } while (uVar3 + 1 != iVar5);
    }
    this = local_68;
    dVar9 = local_48 - (double)(int)local_70;
    uVar8 = -(ulong)(dVar9 < -dVar9);
    if (1e-06 < (double)(~uVar8 & (ulong)dVar9 | (ulong)-dVar9 & uVar8)) {
      QPainter::restore();
      QPainter::save();
      local_b0 = (double)this->radius;
      local_a8 = local_b0;
      QPainter::translate((QPointF *)painter);
      QPainter::rotate(params->startScaleAngle + params->scaleDegree);
      QPainter::setPen((QColor *)painter);
      local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
      local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->gridLabelSize) -
                                            params->margin) << 0x20);
      QPainter::drawLines((QLine *)painter,(int)&local_b0);
      local_b0 = params->startScaleAngle + params->scaleDegree;
      QtPrivate::QPodArrayOps<double>::emplace<double&>
                (&local_98,local_98.super_QArrayDataPointer<double>.size,&local_b0);
    }
  }
  QPainter::restore();
  if (0.0 < this->scaleStep) {
    QPainter::save();
    QPainter::setPen((QColor *)painter);
    local_b0 = (double)this->radius;
    local_a8 = local_b0;
    QPainter::translate((QPointF *)painter);
    QPainter::rotate(params->startScaleAngle);
    local_68 = (MeterPrivate *)((this->maxValue - this->minValue) / this->scaleStep);
    uStack_60 = 0;
    local_a0 = params->scaleDegree / (double)(int)(double)local_68;
    QPainter::rotate(local_a0);
    iVar5 = (int)(double)local_68;
    if (1 < iVar5) {
      iVar6 = 0;
      do {
        if (local_98.super_QArrayDataPointer<double>.size < 1) {
LAB_0010940a:
          lVar4 = -1;
        }
        else {
          dVar9 = (double)iVar6 * local_a0 + params->startScaleAngle + local_a0;
          lVar4 = -8;
          do {
            lVar1 = local_98.super_QArrayDataPointer<double>.size * -8 + lVar4;
            if (lVar1 == -8) goto LAB_00109404;
            dVar2 = *(double *)((long)local_98.super_QArrayDataPointer<double>.ptr + lVar4 + 8);
            lVar4 = lVar4 + 8;
          } while ((dVar2 != dVar9) || (NAN(dVar2) || NAN(dVar9)));
          lVar4 = lVar4 >> 3;
LAB_00109404:
          if (lVar1 == -8) goto LAB_0010940a;
        }
        if (lVar4 == -1) {
          local_b0 = (double)((ulong)(uint)(int)((double)this->radius - params->margin) << 0x20);
          local_a8 = (double)((ulong)(uint)(int)(((double)this->radius - params->scaleWidth) -
                                                params->margin) << 0x20);
          QPainter::drawLines((QLine *)painter,(int)&local_b0);
        }
        QPainter::rotate(local_a0);
        bVar7 = iVar6 != iVar5 + -2;
        iVar6 = iVar6 + 1;
      } while (bVar7);
    }
    QPainter::restore();
  }
  if (&(local_98.super_QArrayDataPointer<double>.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.super_QArrayDataPointer<double>.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_98.super_QArrayDataPointer<double>.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.super_QArrayDataPointer<double>.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.super_QArrayDataPointer<double>.d)->super_QArrayData,8,8);
    }
  }
  return;
}

Assistant:

void
MeterPrivate::drawScale( QPainter & painter, DrawParams & params )
{
	painter.save();
	painter.setPen( textColor );
	painter.drawArc( params.rect -
	QMarginsF( params.margin, params.margin, params.margin, params.margin ),
		( -90.0 - params.startScaleAngle ) * 16, -params.scaleDegree * 16 );
	painter.translate( radius, radius );
	painter.rotate( params.startScaleAngle );

	QVector< qreal > alreadyDrawn;
	alreadyDrawn.append( params.startScaleAngle );

	if( scaleGridStep > 0.0 )
	{
		const int stepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal fullStepsCount = ( ( maxValue - minValue ) / scaleGridStep );
		const qreal scaleStepInDegree = params.scaleDegree / ( maxValue - minValue ) * scaleGridStep;

		for( int i = 0; i <= stepsCount; ++i )
		{
			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );
			painter.rotate( scaleStepInDegree );
			alreadyDrawn.append( params.startScaleAngle + i * scaleStepInDegree );
		}

		if( qAbs( fullStepsCount - stepsCount ) > 0.000001 )
		{
			painter.restore();

			painter.save();

			painter.translate( radius, radius );
			painter.rotate( params.startScaleAngle + params.scaleDegree );
			painter.setPen( textColor );

			painter.drawLine( 0, radius - params.margin, 0,
				radius - params.gridLabelSize - params.margin );

			alreadyDrawn.append( params.startScaleAngle + params.scaleDegree );
		}
	}
	else
	{
		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );

		painter.rotate( params.scaleDegree );

		alreadyDrawn.append( params.scaleDegree );

		painter.drawLine( 0, radius - params.margin, 0,
			radius - params.gridLabelSize - params.margin );
	}

	painter.restore();

	if( scaleStep > 0.0 )
	{
		painter.save();
		painter.setPen( textColor );
		painter.translate( radius, radius );
		painter.rotate( params.startScaleAngle );

		int stepsCount = ( ( maxValue - minValue ) / scaleStep );
		const qreal scaleStepInDegree = params.scaleDegree / stepsCount;

		stepsCount -= 2;

		painter.rotate( scaleStepInDegree );

		for( int i = 0; i <= stepsCount; ++i )
		{
			if( !alreadyDrawn.contains( ( params.startScaleAngle + scaleStepInDegree )
				+ i * scaleStepInDegree ) )
					painter.drawLine( 0, radius - params.margin, 0,
						radius - params.scaleWidth - params.margin );

			painter.rotate( scaleStepInDegree );
		}

		painter.restore();
	}
}